

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeMemoryReporterTest.cpp
# Opt level: O0

void __thiscall
TEST_CodeMemoryReportFormatter_twoMallocAndTwoFree_Test::
TEST_CodeMemoryReportFormatter_twoMallocAndTwoFree_Test
          (TEST_CodeMemoryReportFormatter_twoMallocAndTwoFree_Test *this)

{
  TEST_CodeMemoryReportFormatter_twoMallocAndTwoFree_Test *this_local;
  
  memset(this,0,0x70);
  TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter::
  TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter
            (&this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter);
  (this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_CodeMemoryReportFormatter_twoMallocAndTwoFree_Test_0033d540;
  return;
}

Assistant:

TEST(CodeMemoryReportFormatter, twoMallocAndTwoFree)
{
    formatter->report_alloc_memory(testResult, cAllocator, 10, memory01, "file", 2);
    formatter->report_alloc_memory(testResult, cAllocator, 10, memory02, "boo", 4);
    testOutput.flush();
    formatter->report_free_memory(testResult, cAllocator, memory01, "foo", 6);
    formatter->report_free_memory(testResult, cAllocator, memory02, "bar", 8);
    TESTOUTPUT_CONTAINS("\tfree(file_2_1); /* at foo:6 */\n");
    TESTOUTPUT_CONTAINS("\tfree(boo_4_1); /* at bar:8 */\n");
}